

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::parseHeaderValue(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  bool bVar1;
  TokenizerException *pTVar2;
  char *pcVar3;
  byte local_279;
  tokenValue local_1e8;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  _Optional_payload_base<char> local_194;
  undefined1 local_192;
  allocator<char> local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_12a;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  char local_c6;
  byte local_c5;
  undefined4 local_c4;
  undefined1 local_c0 [2];
  char slashed;
  bool backslash;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  _Optional_payload_base<char> local_70;
  _Optional_payload_base<char> local_6e [4];
  optional<char> _;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string res;
  char c_local;
  Tokenizer *this_local;
  
  res.field_2._M_local_buf[0xf] = c;
  std::__cxx11::string::string((string *)&local_60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,res.field_2._M_local_buf[0xf]);
  std::__cxx11::string::~string((string *)&local_60);
  std::optional<char>::optional((optional<char> *)local_6e);
  local_70 = (_Optional_payload_base<char>)next(this);
  local_6e[0] = local_70;
  bVar1 = std::optional<char>::has_value((optional<char> *)local_6e);
  if (!bVar1) {
    local_92 = 1;
    pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Unexpected EOF when parsing HeaderValue in HeaderBlock",
               &local_91);
    TokenizerException::TokenizerException
              (pTVar2,&local_90,this->line_number,this->col_number,&this->current_line);
    local_92 = 0;
    __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
  }
  pcVar3 = std::optional<char>::value((optional<char> *)local_6e);
  res.field_2._M_local_buf[0xf] = *pcVar3;
  if (res.field_2._M_local_buf[0xf] == '\n') {
    unnext(this);
    std::variant<int,double,std::__cxx11::string,bool,char>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,double,std::__cxx11::string,bool,char> *)local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    Token::Token(__return_storage_ptr__,HeaderValue,(tokenValue *)local_c0);
    std::
    variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::~variant((variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)local_c0);
  }
  else {
    local_c5 = 0;
    do {
      if ((local_c5 & 1) == 0) {
        bVar1 = isValidHeaderValueChar(res.field_2._M_local_buf[0xf]);
        if (!bVar1) {
          local_192 = 1;
          pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"Invalid char \"",&local_191);
          std::operator+(&local_170,&local_190,res.field_2._M_local_buf[0xf]);
          std::operator+(&local_150,&local_170,"\" in HeaderValue");
          TokenizerException::TokenizerException
                    (pTVar2,&local_150,this->line_number,this->col_number,&this->current_line);
          local_192 = 0;
          __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
        }
        if (res.field_2._M_local_buf[0xf] == '\\') {
          local_c5 = 1;
        }
        else {
          local_c5 = 0;
          std::__cxx11::string::operator+=((string *)local_40,res.field_2._M_local_buf[0xf]);
        }
      }
      else {
        local_c5 = 0;
        local_c6 = doBackslash(res.field_2._M_local_buf[0xf]);
        bVar1 = isValidHeaderValueChar(local_c6);
        if (!bVar1) {
          local_12a = 1;
          pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"Invalid char \"\\",&local_129);
          std::operator+(&local_108,&local_128,res.field_2._M_local_buf[0xf]);
          std::operator+(&local_e8,&local_108,"\" in HeaderValue");
          TokenizerException::TokenizerException
                    (pTVar2,&local_e8,this->line_number,this->col_number,&this->current_line);
          local_12a = 0;
          __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
        }
        std::__cxx11::string::operator+=((string *)local_40,local_c6);
      }
      local_194 = (_Optional_payload_base<char>)next(this);
      local_6e[0] = local_194;
      bVar1 = std::optional<char>::has_value((optional<char> *)local_6e);
      if (!bVar1) {
        local_1ba = 1;
        pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"Unexpected EOF when parsing HeaderValue in HeaderBlock",
                   &local_1b9);
        TokenizerException::TokenizerException
                  (pTVar2,&local_1b8,this->line_number,this->col_number,&this->current_line);
        local_1ba = 0;
        __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
      }
      pcVar3 = std::optional<char>::value((optional<char> *)local_6e);
      res.field_2._M_local_buf[0xf] = *pcVar3;
      local_279 = 1;
      if (res.field_2._M_local_buf[0xf] == '\n') {
        local_279 = local_c5;
      }
    } while ((local_279 & 1) != 0);
    unnext(this);
    std::variant<int,double,std::__cxx11::string,bool,char>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,double,std::__cxx11::string,bool,char> *)&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    Token::Token(__return_storage_ptr__,HeaderValue,&local_1e8);
    std::
    variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::~variant(&local_1e8);
  }
  local_c4 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseHeaderValue(char c) {
    string res = string() + c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF when parsing HeaderValue in HeaderBlock", line_number, col_number,
                                 current_line);
    }
    c = _.value();
    if (c == '\n') {
        unnext();
        return Token(HeaderValue, res);
    }
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            char slashed = doBackslash(c);
            if (!isValidHeaderValueChar(slashed)) {
                throw TokenizerException(string("Invalid char \"\\") + c + "\" in HeaderValue", line_number, col_number,
                                         current_line);
            }
            res += slashed;
        } else {
            if (!isValidHeaderValueChar(c)) {
                throw TokenizerException(string("Invalid char \"") + c + "\" in HeaderValue", line_number, col_number,
                                         current_line);
            }
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF when parsing HeaderValue in HeaderBlock", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != '\n' || backslash);
    unnext();
    return Token(HeaderValue, res);
}